

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

Am_Wrapper * sub_menu_font_from_win_for_item_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_38;
  Am_Object local_30;
  undefined1 local_28 [8];
  Am_Value v;
  Am_Object *self_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)self;
  Am_Value::Am_Value((Am_Value *)local_28);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)v.value.long_value,0x68);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_38,0x1d3);
  in_value = Am_Object::Peek(&local_30,0xac,0);
  Am_Value::operator=((Am_Value *)local_28,in_value);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_38);
  bVar1 = Am_Value::Valid((Am_Value *)local_28);
  if (bVar1) {
    self_local = (Am_Object *)Am_Value::operator_cast_to_Am_Wrapper_((Am_Value *)local_28);
  }
  else {
    self_local = (Am_Object *)Am_Font::operator_cast_to_Am_Wrapper_(&Am_Default_Font);
  }
  Am_Value::~Am_Value((Am_Value *)local_28);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Font_Formula(sub_menu_font_from_win_for_item)
{
  Am_Value v;
  v = self.Get_Object(Am_WINDOW).Get_Object(Am_FOR_ITEM).Peek(Am_FONT);
  if (v.Valid())
    return v;
  else
    return Am_Default_Font;
}